

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeOpen(sqlite3_vfs *pVfs,char *zFilename,sqlite3 *db,Btree **ppBtree,int flags,
                    int vfsFlags)

{
  char cVar1;
  sqlite3_file *psVar2;
  sqlite3_io_methods *psVar3;
  PCache *pCache;
  long lVar4;
  sqlite3 *psVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Btree *p;
  BtShared *__s;
  size_t sVar11;
  Btree *pBVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  Btree *pBVar16;
  void *pvVar17;
  ulong uVar18;
  sqlite3_mutex *psVar19;
  sqlite3_mutex *psVar20;
  Btree **ppBVar21;
  code *pcVar22;
  long lVar23;
  Btree *pBVar24;
  u8 uVar25;
  u64 n;
  char *__dest;
  byte bVar26;
  Pager *pPVar27;
  ulong uVar28;
  uint uVar29;
  char *pcVar30;
  bool bVar31;
  u32 szPageDflt;
  uchar zDbHeader [100];
  sqlite3_mutex *local_130;
  Pager *local_120;
  u32 local_10c;
  Pager *local_108;
  uint local_fc;
  char *local_f8;
  sqlite3 *local_f0;
  char *local_e8;
  ulong local_e0;
  uint local_d4;
  undefined8 local_d0;
  char *local_c8;
  size_t local_c0;
  Btree **local_b8;
  size_t local_b0;
  BtShared *local_a8;
  uint local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 extraout_var;
  
  local_e8 = zFilename;
  if (zFilename == (char *)0x0) {
    bVar31 = true;
LAB_0012bef3:
    if ((!bVar31) || (uVar10 = 1, db->temp_store != '\x02')) {
      uVar10 = (uint)vfsFlags >> 7 & 1;
    }
  }
  else {
    bVar31 = *zFilename == '\0';
    iVar7 = strcmp(zFilename,":memory:");
    if (iVar7 != 0) goto LAB_0012bef3;
    uVar10 = 1;
  }
  local_fc = flags | 2;
  bVar6 = (byte)uVar10;
  if (uVar10 == 0) {
    local_fc = flags;
  }
  uVar10 = vfsFlags & 0xfffffcffU | 0x200;
  if (bVar6 == 0 && !bVar31) {
    uVar10 = vfsFlags;
  }
  if ((vfsFlags & 0x100U) == 0) {
    uVar10 = vfsFlags;
  }
  p = (Btree *)sqlite3Malloc(0x48);
  if (p == (Btree *)0x0) {
    return 7;
  }
  p->db = (sqlite3 *)0x0;
  p->pBt = (BtShared *)0x0;
  (p->lock).pBtree = (Btree *)0x0;
  (p->lock).iTable = 0;
  (p->lock).eLock = '\0';
  *(undefined3 *)&(p->lock).field_0xd = 0;
  p->pNext = (Btree *)0x0;
  p->pPrev = (Btree *)0x0;
  p->inTrans = '\0';
  p->sharable = '\0';
  p->locked = '\0';
  p->hasIncrblobCur = '\0';
  p->wantToLock = 0;
  p->nBackup = 0;
  p->iBDataVersion = 0;
  (p->lock).pNext = (BtLock *)0x0;
  p->db = db;
  (p->lock).pBtree = p;
  (p->lock).iTable = 1;
  local_f0 = db;
  local_b8 = ppBtree;
  if ((!bVar31) && ((uVar10 >> 0x11 & 1) != 0 && ((uVar10 & 0x40) == 0 & bVar6) == 0)) {
    if (local_e8 == (char *)0x0) {
      uVar8 = 1;
    }
    else {
      sVar11 = strlen(local_e8);
      uVar8 = ((uint)sVar11 & 0x3fffffff) + 1;
    }
    uVar9 = pVfs->mxPathname + 1;
    uVar29 = uVar8;
    if ((int)uVar8 < (int)uVar9) {
      uVar29 = uVar9;
    }
    pBVar12 = (Btree *)sqlite3Malloc((ulong)uVar29);
    p->sharable = '\x01';
    if (pBVar12 != (Btree *)0x0) {
      if (bVar6 == 0) {
        *(undefined1 *)&pBVar12->db = 0;
        uVar8 = (*pVfs->xFullPathname)(pVfs,local_e8,uVar9,(char *)pBVar12);
        if ((uVar8 & 0xfffffdff) != 0) {
          sqlite3_free(pBVar12);
          bVar31 = false;
          local_130 = (sqlite3_mutex *)0x0;
          __s = (BtShared *)0x0;
          pBVar12 = p;
          uVar29 = uVar8;
          goto LAB_0012c8ab;
        }
      }
      else {
        memcpy(pBVar12,local_e8,(ulong)uVar8);
      }
      psVar5 = local_f0;
      if (sqlite3Config.bCoreMutex == '\0') {
        local_130 = (sqlite3_mutex *)0x0;
      }
      else {
        local_130 = (*sqlite3Config.mutex.xMutexAlloc)(4);
      }
      if (local_130 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(local_130);
      }
      if (sqlite3Config.bCoreMutex == '\0') {
        psVar19 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar19 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      __s = sqlite3SharedCacheList;
      if (psVar19 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar19);
        __s = sqlite3SharedCacheList;
      }
      for (; __s != (BtShared *)0x0; __s = __s->pNext) {
        pPVar27 = __s->pPager;
        iVar7 = strcmp((char *)pBVar12,pPVar27->zFilename);
        if ((iVar7 == 0) && (pPVar27->pVfs == pVfs)) {
          lVar23 = (long)psVar5->nDb;
          bVar31 = lVar23 < 1;
          if (lVar23 < 1) goto LAB_0012c4e9;
          ppBVar21 = &psVar5->aDb[lVar23 + -1].pBt;
          lVar23 = lVar23 + 1;
          goto LAB_0012c4c6;
        }
      }
      goto LAB_0012c88b;
    }
    uVar8 = 7;
    bVar31 = false;
    uVar29 = 0;
    local_130 = (sqlite3_mutex *)0x0;
    __s = (BtShared *)0x0;
    pBVar12 = p;
    goto LAB_0012c8ab;
  }
  uVar29 = 0;
  local_130 = (sqlite3_mutex *)0x0;
  __s = (BtShared *)0x0;
  goto LAB_0012bfb0;
LAB_0012c006:
  do {
    pBVar16 = pBVar12;
    pBVar12 = pBVar16->pPrev;
  } while (pBVar16->pPrev != (Btree *)0x0);
  if (p->pBt < pBVar16->pBt) {
    p->pNext = pBVar16;
    ppBVar21 = &pBVar16->pPrev;
    p->pPrev = (Btree *)0x0;
  }
  else {
    do {
      pBVar12 = pBVar16;
      pBVar16 = pBVar12->pNext;
      if (pBVar16 == (Btree *)0x0) {
        p->pNext = (Btree *)0x0;
        pBVar16 = p;
        pBVar24 = pBVar12;
        goto LAB_0012c500;
      }
    } while (pBVar16->pBt < p->pBt);
    p->pNext = pBVar16;
    p->pPrev = pBVar12;
    pBVar24 = p;
    if (pBVar16 != (Btree *)0x0) {
LAB_0012c500:
      pBVar16->pPrev = pBVar24;
    }
    ppBVar21 = &pBVar12->pNext;
  }
  *ppBVar21 = p;
  goto LAB_0012c50b;
  while( true ) {
    lVar15 = lVar23 + -1;
    ppBVar21 = ppBVar21 + -4;
    lVar4 = lVar23 + -3;
    bVar31 = lVar15 < 2;
    lVar23 = lVar15;
    if (SBORROW8(lVar15,2) != lVar4 < 0) break;
LAB_0012c4c6:
    if ((*ppBVar21 != (Btree *)0x0) && ((*ppBVar21)->pBt == __s)) {
      if (psVar19 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar19);
      }
      if (local_130 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(local_130);
      }
      sqlite3_free(pBVar12);
      sqlite3_free(p);
      goto LAB_0012c885;
    }
  }
LAB_0012c4e9:
  p->pBt = __s;
  __s->nRef = __s->nRef + 1;
LAB_0012c885:
  if (bVar31) {
LAB_0012c88b:
    uVar8 = 0x13;
    bVar31 = true;
    uVar29 = 0;
    if (psVar19 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar19);
    }
LAB_0012c8ab:
    sqlite3_free(pBVar12);
  }
  else {
    uVar8 = 0x13;
    bVar31 = false;
    uVar29 = 0;
  }
  if (!bVar31) {
    return uVar8;
  }
LAB_0012bfb0:
  if (__s == (BtShared *)0x0) {
    local_88 = 0;
    __s = (BtShared *)sqlite3Malloc(0x98);
    if (__s == (BtShared *)0x0) {
      uVar29 = 7;
      __s = (BtShared *)0x0;
      goto LAB_0012c516;
    }
    memset(__s,0,0x98);
    local_10c = 0x1000;
    pPVar27 = (Pager *)0x50;
    if (0x50 < pVfs->szOsFile) {
      pPVar27 = (Pager *)(ulong)(uint)pVfs->szOsFile;
    }
    __s->pPager = (Pager *)0x0;
    local_d4 = local_fc & 2;
    local_a8 = __s;
    if (local_d4 == 0) {
      local_d0 = 0;
LAB_0012c175:
      local_120 = (Pager *)0x0;
      uVar8 = 0;
      local_c8 = local_e8;
LAB_0012c2bd:
      iVar7 = 1;
      if ((local_c8 == (char *)0x0) || (*local_c8 == '\0')) {
        uVar18 = 0;
        local_f8 = (char *)0x0;
      }
      else {
        uVar8 = pVfs->mxPathname + 1;
        local_108 = pPVar27;
        local_120 = (Pager *)sqlite3Malloc((long)pVfs->mxPathname * 2 + 2);
        uVar18 = 0;
        if (local_120 == (Pager *)0x0) {
          uVar29 = 7;
          iVar7 = 1;
          local_f8 = (char *)0x0;
          bVar31 = false;
        }
        else {
          *(char *)&local_120->pVfs = '\0';
          uVar8 = (*pVfs->xFullPathname)(pVfs,local_c8,uVar8,(char *)local_120);
          uVar29 = (int)(uVar10 << 7) >> 0x1f & 0x60e;
          if (uVar8 != 0x200) {
            uVar29 = uVar8;
          }
          sVar11 = strlen((char *)local_120);
          pcVar30 = local_c8;
          sVar13 = strlen(local_c8);
          pcVar30 = pcVar30 + (ulong)((uint)sVar13 & 0x3fffffff) + 1;
          cVar1 = *pcVar30;
          local_f8 = pcVar30;
          while (cVar1 != '\0') {
            sVar13 = strlen(pcVar30);
            sVar14 = strlen(pcVar30 + sVar13 + 1);
            pcVar30 = pcVar30 + sVar14 + sVar13 + 2;
            cVar1 = *pcVar30;
          }
          uVar8 = (uint)sVar11 & 0x3fffffff;
          iVar7 = (int)local_f8;
          if ((uVar29 == 0) && (uVar29 = 0, pVfs->mxPathname < (int)(uVar8 + 8))) {
            uVar29 = 0xe;
            sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xf1c9,
                        "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
          }
          uVar18 = 0;
          iVar7 = ((int)pcVar30 - iVar7) + 1;
          if (uVar29 == 0) {
            bVar31 = true;
          }
          else {
            sqlite3_free(local_120);
            bVar31 = false;
            uVar18 = (ulong)uVar29;
          }
        }
        pPVar27 = local_108;
        if (!bVar31) goto LAB_0012caed;
      }
      uVar28 = (ulong)((int)pPVar27 + 7U & 0x7ffffff8);
      local_c0 = (size_t)(int)uVar8;
      local_b0 = (size_t)iVar7;
      n = ((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) + local_c0 * 3 + uVar28 * 2 + local_b0 +
          0x1a6;
      local_e0 = uVar18;
      pPVar27 = (Pager *)sqlite3Malloc(n);
      if (pPVar27 == (Pager *)0x0) {
        uVar29 = 7;
        if (local_120 == (Pager *)0x0) goto LAB_0012caed;
      }
      else {
        memset(pPVar27,0,n);
        sVar11 = local_c0;
        pPVar27->pPCache = (PCache *)(pPVar27 + 1);
        pPVar27->fd = (sqlite3_file *)&pPVar27[1].jfd;
        pcVar30 = pPVar27[1].dbFileVers + (((long)pVfs->szOsFile + 7U & 0xfffffffffffffff8) - 0x38);
        pPVar27->sjfd = (sqlite3_file *)pcVar30;
        pcVar30 = pcVar30 + uVar28;
        pPVar27->jfd = (sqlite3_file *)pcVar30;
        __dest = pcVar30 + uVar28 + 0xc;
        *(Pager **)(pcVar30 + uVar28) = pPVar27;
        pPVar27->zFilename = __dest;
        local_108 = pPVar27;
        if (0 < (int)uVar8) {
          memcpy(__dest,local_120,local_c0);
          sVar13 = local_b0;
          if (local_f8 == (char *)0x0) {
            __dest = __dest + sVar11 + 2;
          }
          else {
            memcpy(__dest + sVar11 + 1,local_f8,local_b0);
            __dest = __dest + sVar13 + sVar11 + 1;
          }
        }
        sVar11 = local_c0;
        if ((int)uVar8 < 1) {
          local_108->zJournal = (char *)0x0;
          local_108->zWal = (char *)0x0;
        }
        else {
          local_108->zJournal = __dest;
          memcpy(__dest,local_120,local_c0);
          sVar13 = local_c0;
          pcVar30 = __dest + sVar11;
          *(undefined8 *)pcVar30 = 0x6c616e72756f6a2d;
          local_108->zWal = pcVar30 + 9;
          memcpy(pcVar30 + 9,local_120,local_c0);
          builtin_strncpy(__dest + sVar13 + sVar11 + 9,"-wal",4);
        }
        pcVar30 = local_c8;
        if ((local_120 != (Pager *)0x0) && (uVar8 != 0)) {
          sqlite3_free(local_120);
        }
        local_120 = local_108;
        local_108->pVfs = pVfs;
        local_108->vfsFlags = uVar10;
        if ((pcVar30 == (char *)0x0) || (*pcVar30 == '\0')) {
          uVar8 = 0;
          uVar29 = (uint)local_e0;
LAB_0012c959:
          local_120->eState = '\x01';
          local_120->eLock = '\x04';
          local_120->noLock = '\x01';
          bVar26 = (byte)uVar10 & 1;
          uVar25 = '\x01';
        }
        else {
          local_9c = 0;
          iVar7 = (*pVfs->xOpen)(pVfs,local_108->zFilename,local_108->fd,uVar10 & 0x1087f7f,
                                 (int *)&local_9c);
          uVar18 = CONCAT44(extraout_var,iVar7);
          uVar8 = local_9c >> 7 & 1;
          local_120->memVfs = (byte)(local_9c >> 7) & 1;
          uVar29 = local_9c & 1;
          bVar26 = (byte)uVar29;
          bVar31 = true;
          if (iVar7 == 0) {
            psVar3 = local_120->fd->pMethods;
            local_e0 = uVar18;
            if (psVar3 == (sqlite3_io_methods *)0x0) {
              bVar31 = true;
            }
            else {
              uVar9 = (*psVar3->xDeviceCharacteristics)(local_120->fd);
              bVar31 = (uVar9 >> 0xd & 1) == 0;
            }
            if (uVar29 == 0) {
              setSectorSize(local_120);
              uVar29 = local_120->sectorSize;
              if ((local_10c < uVar29) && (local_10c = uVar29, 0x2000 < uVar29)) {
                local_10c = 0x2000;
              }
            }
            iVar7 = sqlite3_uri_boolean(local_120->zFilename,"nolock",0);
            local_120->noLock = (u8)iVar7;
            if ((bVar31) &&
               (iVar7 = sqlite3_uri_boolean(local_120->zFilename,"immutable",0), iVar7 == 0)) {
              bVar31 = true;
              uVar18 = local_e0;
            }
            else {
              uVar10 = 1;
              bVar31 = false;
              uVar18 = local_e0;
            }
          }
          uVar29 = (uint)uVar18;
          if (!bVar31) goto LAB_0012c959;
          uVar25 = '\0';
        }
        if (uVar29 == 0) {
          uVar29 = sqlite3PagerSetPagesize(local_120,&local_10c,-1);
        }
        if (uVar29 == 0) {
          pcVar22 = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          if (local_d4 == 0) {
            pcVar22 = pagerStress;
          }
          pCache = local_120->pPCache;
          pCache->szCache = 0;
          pCache->szSpill = 0;
          pCache->szPage = 0;
          pCache->szExtra = 0;
          pCache->bPurgeable = '\0';
          pCache->eCreate = '\0';
          *(undefined6 *)&pCache->field_0x32 = 0;
          pCache->xStress = (_func_int_void_ptr_PgHdr_ptr *)0x0;
          pCache->pStress = (void *)0x0;
          pCache->pCache = (sqlite3_pcache *)0x0;
          pCache->pSynced = (PgHdr *)0x0;
          pCache->nRefSum = 0;
          pCache->pDirty = (PgHdr *)0x0;
          pCache->pDirtyTail = (PgHdr *)0x0;
          pCache->szPage = 1;
          pCache->szExtra = 0x88;
          pCache->bPurgeable = (byte)(local_d4 >> 1) ^ 1;
          pCache->eCreate = '\x02';
          pCache->xStress = pcVar22;
          pCache->pStress = local_120;
          pCache->szCache = 100;
          pCache->szSpill = 1;
          uVar29 = sqlite3PcacheSetPageSize(pCache,local_10c);
        }
        if (uVar29 == 0) {
          uVar10 = local_fc & 1;
          local_120->useJournal = (byte)uVar10 ^ 1;
          local_120->mxPgno = 0xfffffffe;
          local_120->tempFile = uVar25;
          local_120->exclusiveMode = uVar25;
          local_120->changeCountDone = uVar25;
          local_120->memDb = (u8)local_d0;
          local_120->readOnly = bVar26;
          sqlite3PagerSetFlags(local_120,0x23);
          local_120->nExtra = 0x88;
          local_120->journalSizeLimit = -1;
          setSectorSize(local_120);
          uVar25 = '\x02';
          if (uVar10 == 0) {
            uVar25 = '\x04';
            local_d4 = local_d4 | uVar8;
            if (local_d4 != 0) goto LAB_0012caa1;
          }
          else {
LAB_0012caa1:
            local_120->journalMode = uVar25;
          }
          local_120->xReiniter = pageReinit;
          if (local_120->errCode == 0) {
            if (local_120->bUseFetch == '\0') {
              pcVar22 = getPageNormal;
            }
            else {
              pcVar22 = getPageMMap;
            }
          }
          else {
            pcVar22 = getPageError;
          }
          local_120->xGet = pcVar22;
          __s->pPager = local_120;
          uVar29 = 0;
          goto LAB_0012caed;
        }
        psVar2 = local_120->fd;
        if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar2->pMethods->xClose)(psVar2);
          psVar2->pMethods = (sqlite3_io_methods *)0x0;
        }
        pcache1Free(local_120->pTmpSpace);
      }
      sqlite3_free(local_120);
    }
    else {
      if (local_e8 == (char *)0x0) {
        local_d0 = 1;
        local_120 = (Pager *)0x0;
        uVar8 = 0;
        local_c8 = (char *)0x0;
        goto LAB_0012c2bd;
      }
      if (*local_e8 == '\0') {
        local_d0 = 1;
        goto LAB_0012c175;
      }
      local_120 = (Pager *)sqlite3DbStrDup((sqlite3 *)0x0,local_e8);
      if (local_120 != (Pager *)0x0) {
        local_d0 = CONCAT71((int7)((ulong)local_120 >> 8),1);
        sVar11 = strlen((char *)local_120);
        uVar8 = (uint)sVar11 & 0x3fffffff;
        local_c8 = (char *)0x0;
        goto LAB_0012c2bd;
      }
      uVar29 = 7;
    }
LAB_0012caed:
    pcVar30 = local_e8;
    if (uVar29 == 0) {
      pPVar27 = __s->pPager;
      pPVar27->szMmap = local_f0->szMmap;
      pagerFixMaplimit(pPVar27);
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_38 = 0;
      psVar2 = __s->pPager->fd;
      psVar3 = psVar2->pMethods;
      if (psVar3 == (sqlite3_io_methods *)0x0) {
        uVar29 = 0;
      }
      else {
        uVar29 = (*psVar3->xRead)(psVar2,&local_98,100,0);
        if (uVar29 == 0x20a) {
          uVar29 = 0;
        }
      }
    }
    if (uVar29 != 0) goto LAB_0012c516;
    __s->openFlags = (u8)local_fc;
    __s->db = local_f0;
    pPVar27 = __s->pPager;
    pPVar27->xBusyHandler = btreeInvokeBusyHandler;
    pPVar27->pBusyHandlerArg = __s;
    psVar3 = pPVar27->fd->pMethods;
    if (psVar3 != (sqlite3_io_methods *)0x0) {
      (*psVar3->xFileControl)(pPVar27->fd,0xf,&pPVar27->xBusyHandler);
    }
    p->pBt = __s;
    __s->pCursor = (BtCursor *)0x0;
    __s->pPage1 = (MemPage *)0x0;
    pPVar27 = __s->pPager;
    if (pPVar27->readOnly != '\0') {
      *(byte *)&__s->btsFlags = (byte)__s->btsFlags | 1;
    }
    iVar7 = (int)((local_88 & 0xff) << 8);
    uVar10 = (uint)local_88._1_1_ * 0x10000 + iVar7;
    __s->pageSize = uVar10;
    if (((iVar7 + (uint)local_88._1_1_ * 0x10000) - 0x10001 < 0xffff01ff) ||
       ((uVar10 + 0x1ffff & uVar10) != 0)) {
      local_a8->pageSize = 0;
      uVar10 = 0;
      if (pcVar30 != (char *)0x0 && bVar6 == 0) {
        __s->autoVacuum = '\0';
        __s->incrVacuum = '\0';
        uVar10 = 0;
      }
    }
    else {
      uVar10 = (uint)local_88._4_1_;
      __s->btsFlags = __s->btsFlags | 2;
      __s->autoVacuum =
           ((local_68._4_4_ >> 0x18 != 0 || (local_68 & 0xff000000000000) != 0) ||
           (local_68 & 0xff0000000000) != 0) || (local_68 & 0xff00000000) != 0;
      __s->incrVacuum =
           (((uint)local_58 >> 0x18 != 0 || (local_58 & 0xff0000) != 0) || (local_58 & 0xff00) != 0)
           || (local_58 & 0xff) != 0;
    }
    uVar29 = sqlite3PagerSetPagesize(pPVar27,&local_a8->pageSize,uVar10);
    if (uVar29 != 0) goto LAB_0012c516;
    __s->usableSize = __s->pageSize - uVar10;
    __s->nRef = 1;
    if (p->sharable == '\0') {
      uVar29 = 0;
      goto LAB_0012bfbc;
    }
    if (sqlite3Config.bCoreMutex == '\0') {
      psVar19 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar19 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (sqlite3Config.bCoreMutex == '\0') {
LAB_0012ccf8:
      if (psVar19 == (sqlite3_mutex *)0x0) {
        __s->pNext = sqlite3SharedCacheList;
        sqlite3SharedCacheList = __s;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar19);
        __s->pNext = sqlite3SharedCacheList;
        sqlite3SharedCacheList = __s;
        (*sqlite3Config.mutex.xMutexLeave)(psVar19);
      }
      uVar29 = 0;
      bVar31 = true;
    }
    else {
      bVar31 = false;
      psVar20 = (*sqlite3Config.mutex.xMutexAlloc)(0);
      __s->mutex = psVar20;
      if (psVar20 != (sqlite3_mutex *)0x0) goto LAB_0012ccf8;
      uVar29 = 7;
    }
    if (!bVar31) goto LAB_0012c516;
  }
LAB_0012bfbc:
  if ((p->sharable != '\0') && (0 < (long)local_f0->nDb)) {
    lVar23 = 0;
    do {
      pBVar12 = *(Btree **)((long)&local_f0->aDb->pBt + lVar23);
      if ((pBVar12 != (Btree *)0x0) && (pBVar12->sharable != '\0')) goto LAB_0012c006;
      lVar23 = lVar23 + 0x20;
    } while ((long)local_f0->nDb * 0x20 != lVar23);
  }
LAB_0012c50b:
  *local_b8 = p;
LAB_0012c516:
  if (uVar29 == 0) {
    pvVar17 = sqlite3BtreeSchema(p,0,(_func_void_void_ptr *)0x0);
    if (pvVar17 == (void *)0x0) {
      sqlite3BtreeSetCacheSize(p,-2000);
    }
    psVar2 = __s->pPager->fd;
    psVar3 = psVar2->pMethods;
    if (psVar3 != (sqlite3_io_methods *)0x0) {
      (*psVar3->xFileControl)(psVar2,0x1e,&__s->db);
    }
  }
  else {
    if ((__s != (BtShared *)0x0) && (__s->pPager != (Pager *)0x0)) {
      sqlite3PagerClose(__s->pPager,(sqlite3 *)0x0);
    }
    sqlite3_free(__s);
    sqlite3_free(p);
    *local_b8 = (Btree *)0x0;
  }
  if (local_130 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(local_130);
  }
  return uVar29;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeOpen(
  sqlite3_vfs *pVfs,      /* VFS to use for this b-tree */
  const char *zFilename,  /* Name of the file containing the BTree database */
  sqlite3 *db,            /* Associated database handle */
  Btree **ppBtree,        /* Pointer to new Btree object written here */
  int flags,              /* Options */
  int vfsFlags            /* Flags passed through to sqlite3_vfs.xOpen() */
){
  BtShared *pBt = 0;             /* Shared part of btree structure */
  Btree *p;                      /* Handle to return */
  sqlite3_mutex *mutexOpen = 0;  /* Prevents a race condition. Ticket #3537 */
  int rc = SQLITE_OK;            /* Result code from this function */
  u8 nReserve;                   /* Byte of unused space on each page */
  unsigned char zDbHeader[100];  /* Database header content */

  /* True if opening an ephemeral, temporary database */
  const int isTempDb = zFilename==0 || zFilename[0]==0;

  /* Set the variable isMemdb to true for an in-memory database, or
  ** false for a file-based database.
  */
#ifdef SQLITE_OMIT_MEMORYDB
  const int isMemdb = 0;
#else
  const int isMemdb = (zFilename && strcmp(zFilename, ":memory:")==0)
                       || (isTempDb && sqlite3TempInMemory(db))
                       || (vfsFlags & SQLITE_OPEN_MEMORY)!=0;
#endif

  assert( db!=0 );
  assert( pVfs!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( (flags&0xff)==flags );   /* flags fit in 8 bits */

  /* Only a BTREE_SINGLE database can be BTREE_UNORDERED */
  assert( (flags & BTREE_UNORDERED)==0 || (flags & BTREE_SINGLE)!=0 );

  /* A BTREE_SINGLE database is always a temporary and/or ephemeral */
  assert( (flags & BTREE_SINGLE)==0 || isTempDb );

  if( isMemdb ){
    flags |= BTREE_MEMORY;
  }
  if( (vfsFlags & SQLITE_OPEN_MAIN_DB)!=0 && (isMemdb || isTempDb) ){
    vfsFlags = (vfsFlags & ~SQLITE_OPEN_MAIN_DB) | SQLITE_OPEN_TEMP_DB;
  }
  p = sqlite3MallocZero(sizeof(Btree));
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  p->inTrans = TRANS_NONE;
  p->db = db;
#ifndef SQLITE_OMIT_SHARED_CACHE
  p->lock.pBtree = p;
  p->lock.iTable = 1;
#endif

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /*
  ** If this Btree is a candidate for shared cache, try to find an
  ** existing BtShared object that we can share with
  */
  if( isTempDb==0 && (isMemdb==0 || (vfsFlags&SQLITE_OPEN_URI)!=0) ){
    if( vfsFlags & SQLITE_OPEN_SHAREDCACHE ){
      int nFilename = sqlite3Strlen30(zFilename)+1;
      int nFullPathname = pVfs->mxPathname+1;
      char *zFullPathname = sqlite3Malloc(MAX(nFullPathname,nFilename));
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )

      p->sharable = 1;
      if( !zFullPathname ){
        sqlite3_free(p);
        return SQLITE_NOMEM_BKPT;
      }
      if( isMemdb ){
        memcpy(zFullPathname, zFilename, nFilename);
      }else{
        rc = sqlite3OsFullPathname(pVfs, zFilename,
                                   nFullPathname, zFullPathname);
        if( rc ){
          if( rc==SQLITE_OK_SYMLINK ){
            rc = SQLITE_OK;
          }else{
            sqlite3_free(zFullPathname);
            sqlite3_free(p);
            return rc;
          }
        }
      }
#if SQLITE_THREADSAFE
      mutexOpen = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_OPEN);
      sqlite3_mutex_enter(mutexOpen);
      mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
      sqlite3_mutex_enter(mutexShared);
#endif
      for(pBt=GLOBAL(BtShared*,sqlite3SharedCacheList); pBt; pBt=pBt->pNext){
        assert( pBt->nRef>0 );
        if( 0==strcmp(zFullPathname, sqlite3PagerFilename(pBt->pPager, 0))
                 && sqlite3PagerVfs(pBt->pPager)==pVfs ){
          int iDb;
          for(iDb=db->nDb-1; iDb>=0; iDb--){
            Btree *pExisting = db->aDb[iDb].pBt;
            if( pExisting && pExisting->pBt==pBt ){
              sqlite3_mutex_leave(mutexShared);
              sqlite3_mutex_leave(mutexOpen);
              sqlite3_free(zFullPathname);
              sqlite3_free(p);
              return SQLITE_CONSTRAINT;
            }
          }
          p->pBt = pBt;
          pBt->nRef++;
          break;
        }
      }
      sqlite3_mutex_leave(mutexShared);
      sqlite3_free(zFullPathname);
    }
#ifdef SQLITE_DEBUG
    else{
      /* In debug mode, we mark all persistent databases as sharable
      ** even when they are not.  This exercises the locking code and
      ** gives more opportunity for asserts(sqlite3_mutex_held())
      ** statements to find locking problems.
      */
      p->sharable = 1;
    }
#endif
  }
#endif
  if( pBt==0 ){
    /*
    ** The following asserts make sure that structures used by the btree are
    ** the right size.  This is to guard against size changes that result
    ** when compiling on a different architecture.
    */
    assert( sizeof(i64)==8 );
    assert( sizeof(u64)==8 );
    assert( sizeof(u32)==4 );
    assert( sizeof(u16)==2 );
    assert( sizeof(Pgno)==4 );

    /* Suppress false-positive compiler warning from PVS-Studio */
    memset(&zDbHeader[16], 0, 8);

    pBt = sqlite3MallocZero( sizeof(*pBt) );
    if( pBt==0 ){
      rc = SQLITE_NOMEM_BKPT;
      goto btree_open_out;
    }
    rc = sqlite3PagerOpen(pVfs, &pBt->pPager, zFilename,
                          sizeof(MemPage), flags, vfsFlags, pageReinit);
    if( rc==SQLITE_OK ){
      sqlite3PagerSetMmapLimit(pBt->pPager, db->szMmap);
      rc = sqlite3PagerReadFileheader(pBt->pPager,sizeof(zDbHeader),zDbHeader);
    }
    if( rc!=SQLITE_OK ){
      goto btree_open_out;
    }
    pBt->openFlags = (u8)flags;
    pBt->db = db;
    sqlite3PagerSetBusyHandler(pBt->pPager, btreeInvokeBusyHandler, pBt);
    p->pBt = pBt;

    pBt->pCursor = 0;
    pBt->pPage1 = 0;
    if( sqlite3PagerIsreadonly(pBt->pPager) ) pBt->btsFlags |= BTS_READ_ONLY;
#if defined(SQLITE_SECURE_DELETE)
    pBt->btsFlags |= BTS_SECURE_DELETE;
#elif defined(SQLITE_FAST_SECURE_DELETE)
    pBt->btsFlags |= BTS_OVERWRITE;
#endif
    /* EVIDENCE-OF: R-51873-39618 The page size for a database file is
    ** determined by the 2-byte integer located at an offset of 16 bytes from
    ** the beginning of the database file. */
    pBt->pageSize = (zDbHeader[16]<<8) | (zDbHeader[17]<<16);
    if( pBt->pageSize<512 || pBt->pageSize>SQLITE_MAX_PAGE_SIZE
         || ((pBt->pageSize-1)&pBt->pageSize)!=0 ){
      pBt->pageSize = 0;
#ifndef SQLITE_OMIT_AUTOVACUUM
      /* If the magic name ":memory:" will create an in-memory database, then
      ** leave the autoVacuum mode at 0 (do not auto-vacuum), even if
      ** SQLITE_DEFAULT_AUTOVACUUM is true. On the other hand, if
      ** SQLITE_OMIT_MEMORYDB has been defined, then ":memory:" is just a
      ** regular file-name. In this case the auto-vacuum applies as per normal.
      */
      if( zFilename && !isMemdb ){
        pBt->autoVacuum = (SQLITE_DEFAULT_AUTOVACUUM ? 1 : 0);
        pBt->incrVacuum = (SQLITE_DEFAULT_AUTOVACUUM==2 ? 1 : 0);
      }
#endif
      nReserve = 0;
    }else{
      /* EVIDENCE-OF: R-37497-42412 The size of the reserved region is
      ** determined by the one-byte unsigned integer found at an offset of 20
      ** into the database file header. */
      nReserve = zDbHeader[20];
      pBt->btsFlags |= BTS_PAGESIZE_FIXED;
#ifndef SQLITE_OMIT_AUTOVACUUM
      pBt->autoVacuum = (get4byte(&zDbHeader[36 + 4*4])?1:0);
      pBt->incrVacuum = (get4byte(&zDbHeader[36 + 7*4])?1:0);
#endif
    }
    rc = sqlite3PagerSetPagesize(pBt->pPager, &pBt->pageSize, nReserve);
    if( rc ) goto btree_open_out;
    pBt->usableSize = pBt->pageSize - nReserve;
    assert( (pBt->pageSize & 7)==0 );  /* 8-byte alignment of pageSize */

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
    /* Add the new BtShared object to the linked list sharable BtShareds.
    */
    pBt->nRef = 1;
    if( p->sharable ){
      MUTEX_LOGIC( sqlite3_mutex *mutexShared; )
      MUTEX_LOGIC( mutexShared = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);)
      if( SQLITE_THREADSAFE && sqlite3GlobalConfig.bCoreMutex ){
        pBt->mutex = sqlite3MutexAlloc(SQLITE_MUTEX_FAST);
        if( pBt->mutex==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto btree_open_out;
        }
      }
      sqlite3_mutex_enter(mutexShared);
      pBt->pNext = GLOBAL(BtShared*,sqlite3SharedCacheList);
      GLOBAL(BtShared*,sqlite3SharedCacheList) = pBt;
      sqlite3_mutex_leave(mutexShared);
    }
#endif
  }

#if !defined(SQLITE_OMIT_SHARED_CACHE) && !defined(SQLITE_OMIT_DISKIO)
  /* If the new Btree uses a sharable pBtShared, then link the new
  ** Btree into the list of all sharable Btrees for the same connection.
  ** The list is kept in ascending order by pBt address.
  */
  if( p->sharable ){
    int i;
    Btree *pSib;
    for(i=0; i<db->nDb; i++){
      if( (pSib = db->aDb[i].pBt)!=0 && pSib->sharable ){
        while( pSib->pPrev ){ pSib = pSib->pPrev; }
        if( (uptr)p->pBt<(uptr)pSib->pBt ){
          p->pNext = pSib;
          p->pPrev = 0;
          pSib->pPrev = p;
        }else{
          while( pSib->pNext && (uptr)pSib->pNext->pBt<(uptr)p->pBt ){
            pSib = pSib->pNext;
          }
          p->pNext = pSib->pNext;
          p->pPrev = pSib;
          if( p->pNext ){
            p->pNext->pPrev = p;
          }
          pSib->pNext = p;
        }
        break;
      }
    }
  }
#endif
  *ppBtree = p;

btree_open_out:
  if( rc!=SQLITE_OK ){
    if( pBt && pBt->pPager ){
      sqlite3PagerClose(pBt->pPager, 0);
    }
    sqlite3_free(pBt);
    sqlite3_free(p);
    *ppBtree = 0;
  }else{
    sqlite3_file *pFile;

    /* If the B-Tree was successfully opened, set the pager-cache size to the
    ** default value. Except, when opening on an existing shared pager-cache,
    ** do not change the pager-cache size.
    */
    if( sqlite3BtreeSchema(p, 0, 0)==0 ){
      sqlite3BtreeSetCacheSize(p, SQLITE_DEFAULT_CACHE_SIZE);
    }

    pFile = sqlite3PagerFile(pBt->pPager);
    if( pFile->pMethods ){
      sqlite3OsFileControlHint(pFile, SQLITE_FCNTL_PDB, (void*)&pBt->db);
    }
  }
  if( mutexOpen ){
    assert( sqlite3_mutex_held(mutexOpen) );
    sqlite3_mutex_leave(mutexOpen);
  }
  assert( rc!=SQLITE_OK || sqlite3BtreeConnectionCount(*ppBtree)>0 );
  return rc;
}